

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O0

string * cppcms::b64url::encode(string *input)

{
  int iVar1;
  size_t s;
  uchar *end_00;
  long lVar2;
  reference pvVar3;
  string *in_RDI;
  uchar *outbuf;
  vector<char,_std::allocator<char>_> buf;
  uchar *end;
  uchar *begin;
  size_t enc_size;
  string *result;
  uchar *begin_00;
  allocator_type *__a;
  string *__n;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  allocator_type local_52;
  undefined1 local_51;
  vector<char,_std::allocator<char>_> local_50;
  uchar *local_38;
  uchar *local_30;
  undefined4 local_24;
  uchar *local_20;
  byte local_11;
  
  local_11 = 0;
  __n = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  s = std::__cxx11::string::size();
  iVar1 = encoded_size(s);
  local_20 = (uchar *)(long)iVar1;
  if (local_20 == (uchar *)0x0) {
    local_11 = 1;
    local_24 = 1;
  }
  else {
    end_00 = (uchar *)std::__cxx11::string::c_str();
    local_30 = end_00;
    lVar2 = std::__cxx11::string::size();
    local_38 = end_00 + lVar2;
    local_51 = 0;
    __a = &local_52;
    begin_00 = local_20;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              (in_stack_ffffffffffffff90,(size_type)__n,(value_type_conflict *)in_RDI,__a);
    std::allocator<char>::~allocator(&local_52);
    std::vector<char,_std::allocator<char>_>::operator[](&local_50,0);
    encode(begin_00,end_00,(uchar *)0x3cef1b);
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&local_50,0);
    std::__cxx11::string::assign((char *)in_RDI,(ulong)pvVar3);
    local_11 = 1;
    local_24 = 1;
    std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)in_RDI)
    ;
  }
  if ((local_11 & 1) == 0) {
    std::__cxx11::string::~string((string *)in_RDI);
  }
  return __n;
}

Assistant:

std::string CPPCMS_API encode(std::string const &input)
{
	std::string result;
	size_t enc_size = encoded_size(input.size());
	if(enc_size == 0)
		return result;
	unsigned char const *begin = reinterpret_cast<unsigned char const *>(input.c_str());
	unsigned char const *end = begin + input.size();
	std::vector<char> buf(enc_size,0);
	unsigned char *outbuf =  reinterpret_cast<unsigned char *>(&buf[0]);
	encode(begin,end,outbuf);
	result.assign(&buf[0],enc_size);
	return result;
}